

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O3

ACT_TYPE __thiscall
despot::TagHistoryModePolicy::Action
          (TagHistoryModePolicy *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  Floor *pFVar1;
  pointer pmVar2;
  pointer piVar3;
  pointer piVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  OBS_TYPE OVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  int iVar12;
  _Base_ptr p_Var13;
  mapped_type *pmVar14;
  undefined8 uVar15;
  ACT_TYPE AVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  vector<int,_std::allocator<int>_> actions;
  Coord rob;
  OBS_TYPE obs;
  int local_8c;
  undefined1 local_88 [8];
  int *piStack_80;
  int *local_78;
  BaseTag *local_68 [2];
  pointer local_58;
  int **ppiStack_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  
  local_38 = (pointer)particles;
  iVar11 = despot::RandomStreams::position();
  if (iVar11 == 0) {
    return this->first_action_;
  }
  iVar11 = despot::RandomStreams::position();
  if (iVar11 == 1) {
    iVar11 = *(int *)(*(long *)(history + 8) + -4);
    local_68[0] = *(BaseTag **)(*(long *)(history + 0x20) + -8);
    pmVar2 = (this->paths_).
             super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var13 = *(_Base_ptr *)((long)&pmVar2[iVar11]._M_t._M_impl.super__Rb_tree_header + 8);
    if (p_Var13 != (_Base_ptr)0x0) {
      p_Var18 = &pmVar2[iVar11]._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var17 = p_Var18;
      do {
        if (*(BaseTag **)(p_Var13 + 1) >= local_68[0]) {
          p_Var17 = p_Var13;
        }
        p_Var13 = (&p_Var13->_M_left)[*(BaseTag **)(p_Var13 + 1) < local_68[0]];
      } while (p_Var13 != (_Base_ptr)0x0);
      if ((p_Var17 != p_Var18) && (*(BaseTag **)(p_Var17 + 1) <= local_68[0])) goto LAB_001141c4;
    }
    local_40 = (pointer)(**(code **)(*(long *)this->tag_model_ + 0x108))
                                  (this->tag_model_,this->belief_);
    ComputeMode((TagHistoryModePolicy *)local_88,(Belief *)this);
    local_68[1]._4_4_ = piStack_80._4_4_;
    despot::Floor::NumCells();
    despot::Floor::NumCells();
    despot::Floor::ComputeShortestPath((int)&local_58,(int)this + 0x30);
    pmVar14 = std::
              map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[]((this->paths_).
                           super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + iVar11,
                           (key_type_conflict *)local_68);
    piVar3 = (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    piVar4 = (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_58;
    (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)ppiStack_50;
    (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_48;
    local_58 = (pointer)0x0;
    ppiStack_50 = (int **)0x0;
    local_48 = (pointer)0x0;
    if ((piVar3 != (pointer)0x0) &&
       (operator_delete(piVar3,(long)piVar4 - (long)piVar3), local_58 != (pointer)0x0)) {
      operator_delete(local_58,(long)local_48 - (long)local_58);
    }
    if (local_40 != (pointer)0x0) {
      (**(code **)(*(long *)local_40 + 8))();
    }
    despot::State::~State((State *)local_88);
  }
LAB_001141c4:
  lVar5 = *(long *)(history + 8);
  lVar6 = *(long *)history;
  iVar11 = despot::RandomStreams::position();
  lVar7 = *(long *)history;
  iVar11 = *(int *)(lVar7 + (long)((int)((ulong)(lVar5 - lVar6) >> 2) - iVar11) * 4);
  lVar5 = *(long *)(history + 8);
  iVar12 = despot::RandomStreams::position();
  local_58 = *(pointer *)
              (*(long *)(history + 0x18) + (long)((int)((ulong)(lVar5 - lVar7) >> 2) - iVar12) * 8);
  pmVar14 = std::
            map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::operator[]((this->paths_).
                         super__Vector_base<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>,_std::allocator<std::map<unsigned_long,_std::vector<int,_std::allocator<int>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<int,_std::allocator<int>_>_>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + iVar11,
                         (key_type_conflict *)&local_58);
  iVar11 = despot::RandomStreams::position();
  if ((ulong)(long)(iVar11 + -1) <
      (ulong)((long)(pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    iVar11 = despot::RandomStreams::position();
    AVar16 = (pmVar14->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start[(long)iVar11 + -1];
  }
  else {
    AVar16 = 4;
    if (*(OBS_TYPE *)(*(long *)(history + 0x20) + -8) != this->tag_model_->same_loc_obs_) {
      local_88 = (undefined1  [8])0x0;
      piStack_80 = (int *)0x0;
      local_78 = (int *)0x0;
      despot::Coord::Coord((Coord *)local_68);
      OVar8 = this->tag_model_->same_loc_obs_;
      pFVar1 = &this->floor_;
      iVar11 = despot::Floor::NumCells();
      if (OVar8 == (long)iVar11) {
        local_68[0] = (BaseTag *)despot::Floor::GetCell((int)pFVar1);
      }
      else {
        local_68[0] = (BaseTag *)
                      BaseTag::MostLikelyRobPosition
                                (this->tag_model_,
                                 (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
                                 local_38);
      }
      local_8c = 0;
      do {
        cVar10 = despot::Compass::Opposite(local_8c,*(int *)(*(long *)(history + 8) + -4));
        if (cVar10 == '\0') {
          uVar15 = despot::operator+((Coord *)local_68,(Coord *)(&Compass::DIRECTIONS + local_8c));
          cVar10 = despot::Floor::Inside(pFVar1,uVar15);
          if (cVar10 != '\0') {
            if (piStack_80 == local_78) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_88,(iterator)piStack_80,&local_8c)
              ;
            }
            else {
              *piStack_80 = local_8c;
              piStack_80 = piStack_80 + 1;
            }
          }
        }
        iVar11 = local_8c + 1;
        bVar9 = local_8c < 3;
        local_8c = iVar11;
      } while (bVar9);
      if ((undefined1  [8])piStack_80 == local_88) {
        local_8c = 0;
        do {
          uVar15 = despot::operator+((Coord *)local_68,(Coord *)(&Compass::DIRECTIONS + local_8c));
          cVar10 = despot::Floor::Inside(pFVar1,uVar15);
          if (cVar10 != '\0') {
            if (piStack_80 == local_78) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        ((vector<int,std::allocator<int>> *)local_88,(iterator)piStack_80,&local_8c)
              ;
            }
            else {
              *piStack_80 = local_8c;
              piStack_80 = piStack_80 + 1;
            }
          }
          iVar11 = local_8c + 1;
          bVar9 = local_8c < 3;
          local_8c = iVar11;
        } while (bVar9);
      }
      if ((undefined1  [8])piStack_80 == local_88) {
        AVar16 = 0;
        if (local_88 == (undefined1  [8])0x0) {
          return 0;
        }
      }
      else {
        iVar11 = despot::Random::NextInt(0x121170);
        AVar16 = *(ACT_TYPE *)((long)local_88 + (long)iVar11 * 4);
      }
      operator_delete((void *)local_88,(long)local_78 - (long)local_88);
    }
  }
  return AVar16;
}

Assistant:

ACT_TYPE Action(const vector<State*>& particles,
		RandomStreams& streams, History& history) const {
		if (streams.position() == 0)
		return first_action_;

		if (streams.position() == 1) {
			ACT_TYPE action = history.LastAction();
			OBS_TYPE obs = history.LastObservation();

			if (paths_[action].find(obs) == paths_[action].end()) {
				Belief* belief = tag_model_->Tau(belief_, action, obs);

				State mode = ComputeMode(belief);
				int rob = tag_model_->StateIndexToRobIndex(mode.state_id);
				int opp = tag_model_->StateIndexToOppIndex(mode.state_id);
				paths_[action][obs] = floor_.ComputeShortestPath(rob, opp);

				delete belief;
			}
		}

		ACT_TYPE action = history.Action(history.Size() - streams.position());
		OBS_TYPE obs = history.Observation(history.Size() - streams.position());
		const vector<int>& policy = paths_[action][obs];

		if (streams.position() - 1 < policy.size()) {
			return policy[streams.position() - 1];
		}

		if (history.LastObservation() == tag_model_->same_loc_obs_)
		return tag_model_->TagAction();

		vector<int> actions;
		// Compute rob position
		Coord rob;
		if (tag_model_->same_loc_obs_ != floor_.NumCells()) {
			rob = tag_model_->MostLikelyRobPosition(particles);
		} else {
			rob = floor_.GetCell(history.LastObservation());
		}

		// Don't double back and don't go into walls
		for (int d = 0; d < 4; d ++) {
			if (!Compass::Opposite(d, history.LastAction()) && floor_.Inside(rob + Compass::DIRECTIONS[d])) {
				actions.push_back(d);
			}
		}

		if (actions.size() == 0) {
			for (int d = 0; d < 4; d ++) {
				if (floor_.Inside(rob + Compass::DIRECTIONS[d]))
				actions.push_back(d);
			}
		}

		if (actions.size() == 0) // Rob may be trapped by the obstacles
		return 0;

		int act = actions[Random::RANDOM.NextInt(actions.size())];
		return act;
	}